

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O1

string * __thiscall
FIX::IntConvertor::convert_abi_cxx11_
          (string *__return_storage_ptr__,IntConvertor *this,signed_int value)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  int iVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  char buffer [11];
  byte abStack_11 [7];
  undefined2 local_a;
  
  puVar1 = &stack0xfffffffffffffff8;
  iVar3 = (int)this;
  uVar7 = (ulong)(uint)-iVar3;
  if (0 < iVar3) {
    uVar7 = (ulong)this & 0xffffffff;
  }
  uVar5 = (uint)uVar7;
  puVar2 = &stack0xfffffffffffffff8;
  if (99 < uVar5) {
    do {
      uVar6 = (uint)uVar7;
      uVar5 = (uint)(uVar7 / 100);
      uVar7 = uVar7 / 100;
      *(undefined2 *)(puVar1 + -2) =
           *(undefined2 *)(digit_pairs + (ulong)(uVar6 + (int)uVar7 * -100) * 2);
      puVar1 = puVar1 + -2;
      puVar2 = puVar1;
    } while (9999 < uVar6);
  }
  if (uVar5 < 10) {
    bVar4 = (byte)uVar5 | 0x30;
    lVar8 = -1;
  }
  else {
    puVar2[-1] = digit_pairs[((ulong)uVar5 * 2 & 0xffffffff) + 1];
    bVar4 = digit_pairs[(ulong)uVar5 * 2];
    lVar8 = -2;
  }
  puVar1 = puVar2 + lVar8;
  puVar2[lVar8] = bVar4;
  if (iVar3 < 0) {
    puVar1[-1] = 0x2d;
    puVar1 = puVar1 + -1;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,puVar1);
  return __return_storage_ptr__;
}

Assistant:

static std::string convert( signed_int value )
  {
    // buffer is big enough for significant digits and extra digit,
    // minus and null
    char buffer[std::numeric_limits<signed_int>::digits10 + 2];
    const char* const start
      = integer_to_string( buffer, sizeof (buffer), value );
    return std::string( start, buffer + sizeof (buffer) - start );
  }